

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void increase_comb_counter_in_groups
               (size_t *ix_arr,size_t st,size_t end,size_t split_ix,size_t n,double *counter,
               double exp_remainder)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  puVar1 = ix_arr + st;
  puVar2 = puVar1;
  uVar3 = (long)((long)ix_arr + (end * 8 - (long)puVar1) + 8) >> 3;
  while (0 < (long)uVar3) {
    uVar4 = uVar3 >> 1;
    uVar6 = ~uVar4 + uVar3;
    uVar3 = uVar4;
    if (puVar2[uVar4] < split_ix) {
      puVar2 = puVar2 + uVar4 + 1;
      uVar3 = uVar6;
    }
  }
  uVar3 = ((long)puVar2 - (long)puVar1 >> 3) + st;
  if (exp_remainder <= 1.0) {
    if (st < uVar3) {
      do {
        if (uVar3 <= end) {
          lVar5 = ix_arr[st] * (n - split_ix);
          uVar4 = uVar3;
          do {
            counter[lVar5 + (ix_arr[uVar4] - split_ix)] =
                 counter[lVar5 + (ix_arr[uVar4] - split_ix)] + 1.0;
            uVar4 = uVar4 + 1;
          } while (uVar4 <= end);
        }
        st = st + 1;
      } while (st != uVar3);
    }
  }
  else if (st < uVar3) {
    do {
      if (uVar3 <= end) {
        lVar5 = ix_arr[st] * (n - split_ix);
        uVar4 = uVar3;
        do {
          counter[lVar5 + (ix_arr[uVar4] - split_ix)] =
               counter[lVar5 + (ix_arr[uVar4] - split_ix)] + exp_remainder;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
      st = st + 1;
    } while (st != uVar3);
  }
  return;
}

Assistant:

void increase_comb_counter_in_groups(size_t ix_arr[], size_t st, size_t end, size_t split_ix, size_t n,
                                     double counter[], double exp_remainder)
{
    size_t *ptr_split_ix = std::lower_bound(ix_arr + st, ix_arr + end + 1, split_ix);
    size_t n_group = std::distance(ix_arr + st, ptr_split_ix);
    n = n - split_ix;

    if (exp_remainder <= 1)
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]++;
    else
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix] += exp_remainder;
}